

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Node * __thiscall
wasm::Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
          (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *this,Expression *curr)

{
  Node *pNVar1;
  
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<wasm::DataFlow::Graph, wasm::DataFlow::Node *>::visit(Expression *) [SubType = wasm::DataFlow::Graph, ReturnType = wasm::DataFlow::Node *]"
                 );
  }
  if ((byte)(curr->_id - BlockId) < 0x5f) {
    pNVar1 = DataFlow::Graph::visitExpression((Graph *)this,curr);
    return pNVar1;
  }
  handle_unreachable("unexpected expression type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                     ,0x46);
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }